

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool __thiscall ClipperLib::PolyNode::IsHole(PolyNode *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = true;
  do {
    bVar2 = bVar1;
    this = this->Parent;
    bVar1 = (bool)(bVar2 ^ 1);
  } while (this != (PolyNode *)0x0);
  return bVar2;
}

Assistant:

bool PolyNode::IsHole() const
{ 
  bool result = true;
  PolyNode* node = Parent;
  while (node)
  {
      result = !result;
      node = node->Parent;
  }
  return result;
}